

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::PositionCommand(UCIAdapter *this,char *params)

{
  byte *pbVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  char *pcVar10;
  bool bVar11;
  char *move;
  Output local_48;
  string *local_40;
  Output local_38;
  
  sVar2 = DAT_001b6788;
  if ((params == (char *)0x0) || (*params == '\0')) goto LAB_001339da;
  if ((DAT_001b6788 == 0) ||
     (iVar5 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788), iVar5 != 0)) {
    bVar11 = false;
  }
  else {
    pp_Var7 = (_func_int **)(params + sVar2);
    cVar3 = params[sVar2];
    uVar6 = (uint)cVar3;
    if (uVar6 != 0) {
      iVar5 = isspace(uVar6);
      bVar11 = iVar5 != 0;
      if (bVar11) {
        params = (char *)pp_Var7;
      }
      if (!bVar11 || cVar3 == '\0') goto LAB_001339d2;
      do {
        iVar5 = isspace((int)(char)uVar6);
        if (iVar5 == 0) break;
        pbVar1 = (byte *)((long)pp_Var7 + 1);
        uVar6 = (uint)*pbVar1;
        pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
      } while (*pbVar1 != 0);
    }
    bVar11 = true;
    params = (char *)pp_Var7;
  }
LAB_001339d2:
  if (bVar11) {
LAB_001339da:
    Output::Output(&local_48,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Position_abi_cxx11_,DAT_001b6888);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::StartPos_abi_cxx11_,DAT_001b6928);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Fen_abi_cxx11_,DAT_001b6748);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <fen_string>} [<movelist>]",0x1b);
    Output::~Output(&local_48);
    Output::Output(&local_48,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Set a new position and apply <movelist> (if given).",0x33);
    Output::~Output(&local_48);
    return;
  }
  iVar5 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar5 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
    (this->lastPosition)._M_string_length = 0;
    *(this->lastPosition)._M_dataplus._M_p = '\0';
  }
  local_40 = &this->lastPosition;
  sVar2 = (this->lastPosition)._M_string_length;
  if ((sVar2 != 0) && (iVar5 = strncmp(params,(local_40->_M_dataplus)._M_p,sVar2), iVar5 == 0)) {
    pp_Var7 = (_func_int **)((long)params + sVar2);
    cVar3 = *(char *)((long)params + sVar2);
    while ((cVar3 != '\0' && (iVar5 = isspace((int)cVar3), iVar5 != 0))) {
      cVar3 = *(char *)((long)pp_Var7 + 1);
      pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
    }
    goto LAB_00133c04;
  }
  sVar2 = DAT_001b6928;
  if ((DAT_001b6928 == 0) ||
     (iVar5 = strncmp(params,token::StartPos_abi_cxx11_,DAT_001b6928), iVar5 != 0)) {
    bVar11 = false;
    pp_Var7 = (_func_int **)params;
  }
  else {
    pp_Var8 = (_func_int **)((long)params + sVar2);
    cVar3 = *(char *)((long)params + sVar2);
    uVar6 = (uint)cVar3;
    pp_Var7 = pp_Var8;
    if (uVar6 != 0) {
      iVar5 = isspace(uVar6);
      bVar4 = iVar5 == 0;
      bVar11 = !bVar4;
      if (bVar4) {
        pp_Var7 = (_func_int **)params;
      }
      if (bVar4 || cVar3 == '\0') goto LAB_00133b54;
      do {
        pp_Var7 = pp_Var8;
        iVar5 = isspace((int)(char)uVar6);
        if (iVar5 == 0) break;
        pbVar1 = (byte *)((long)pp_Var7 + 1);
        uVar6 = (uint)*pbVar1;
        pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
        pp_Var8 = pp_Var7;
      } while (*pbVar1 != 0);
    }
    bVar11 = true;
  }
LAB_00133b54:
  sVar2 = DAT_001b6748;
  if (bVar11) {
    iVar5 = (*this->engine->_vptr_ChessEngine[9])();
    if (CONCAT44(extraout_var,iVar5) == 0) {
      return;
    }
  }
  else {
    if ((DAT_001b6748 != 0) &&
       (iVar5 = strncmp((char *)pp_Var7,token::Fen_abi_cxx11_,DAT_001b6748), iVar5 == 0)) {
      pcVar10 = (char *)((long)pp_Var7 + sVar2);
      cVar3 = *(char *)((long)pp_Var7 + sVar2);
      uVar6 = (uint)cVar3;
      if ((uVar6 != 0) && (iVar5 = isspace(uVar6), iVar5 != 0 && cVar3 != '\0')) {
        do {
          iVar5 = isspace((int)(char)uVar6);
          if (iVar5 == 0) break;
          pbVar1 = (byte *)(pcVar10 + 1);
          uVar6 = (uint)*pbVar1;
          pcVar10 = pcVar10 + 1;
        } while (*pbVar1 != 0);
      }
    }
    iVar5 = (*this->engine->_vptr_ChessEngine[9])();
    pp_Var7 = (_func_int **)CONCAT44(extraout_var_00,iVar5);
  }
LAB_00133c04:
  if (pp_Var7 != (_func_int **)0x0) {
    cVar3 = *(char *)pp_Var7;
    while ((cVar3 != '\0' && (iVar5 = isspace((int)cVar3), iVar5 != 0))) {
      cVar3 = *(char *)((long)pp_Var7 + 1);
      pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
    }
  }
  sVar2 = DAT_001b67c8;
  pp_Var8 = pp_Var7;
  if ((pp_Var7 != (_func_int **)0x0 && DAT_001b67c8 != 0) &&
     (iVar5 = strncmp((char *)pp_Var7,token::Moves_abi_cxx11_,DAT_001b67c8), iVar5 == 0)) {
    pp_Var9 = (_func_int **)((long)pp_Var7 + sVar2);
    cVar3 = *(char *)((long)pp_Var7 + sVar2);
    uVar6 = (uint)cVar3;
    pp_Var8 = pp_Var9;
    if (uVar6 != 0) {
      iVar5 = isspace(uVar6);
      if (iVar5 != 0) {
        pp_Var7 = pp_Var9;
      }
      pp_Var8 = pp_Var7;
      if (iVar5 != 0 && cVar3 != '\0') {
        do {
          iVar5 = isspace((int)(char)uVar6);
          pp_Var8 = pp_Var9;
          if (iVar5 == 0) break;
          pbVar1 = (byte *)((long)pp_Var9 + 1);
          uVar6 = (uint)*pbVar1;
          pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
          pp_Var8 = pp_Var9;
        } while (*pbVar1 != 0);
      }
    }
  }
  if (pp_Var8 == (_func_int **)0x0) {
    params = "";
  }
  else {
    while( true ) {
      if (pp_Var8 != (_func_int **)0x0) {
        cVar3 = *(char *)pp_Var8;
        while ((cVar3 != '\0' && (iVar5 = isspace((int)cVar3), iVar5 != 0))) {
          cVar3 = *(char *)((long)pp_Var8 + 1);
          pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
        }
      }
      if (*(char *)pp_Var8 == '\0') break;
      local_48._vptr_Output = pp_Var8;
      bVar4 = IsMove((char *)pp_Var8);
      bVar11 = true;
      if (bVar4) {
        iVar5 = (*this->engine->_vptr_ChessEngine[10])();
        pp_Var8 = (_func_int **)CONCAT44(extraout_var_01,iVar5);
        if (pp_Var8 == (_func_int **)0x0) {
          Output::Output(&local_38,InfoPrefix);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Invalid move: ",0xe);
          Output::operator<<(&local_38,(char **)&local_48);
          Output::~Output(&local_38);
        }
        else {
          bVar11 = false;
        }
      }
      if ((bVar11) || (pp_Var8 == (_func_int **)0x0)) break;
    }
    if (pp_Var8 == (_func_int **)0x0) {
      params = "";
    }
  }
  pcVar10 = (char *)(this->lastPosition)._M_string_length;
  strlen(params);
  std::__cxx11::string::_M_replace((ulong)local_40,0,pcVar10,(ulong)params);
  if (ChessEngine::_debug != '\x01') {
    return;
  }
  (*this->engine->_vptr_ChessEngine[0xc])();
  return;
}

Assistant:

void UCIAdapter::PositionCommand(const char* params)
{
  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Position << " {" << token::StartPos << "|"
             << token::Fen << " <fen_string>} [<movelist>]";
    Output() << "Set a new position and apply <movelist> (if given).";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
    lastPosition.clear();
  }

  const char* position = params;
  if (lastPosition.size() &&
      !strncmp(params, lastPosition.c_str(), lastPosition.size()))
  {
    NextWord(params += lastPosition.size());
  }
  else {
    if (ParamMatch(token::StartPos, params)) {
      if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
        return;
      }
    }
    else {
      ParamMatch(token::Fen, params);
      params = engine->SetPosition(params);
    }
  }

  // simply consume "moves" token if present
  NextWord(params);
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  lastPosition = params ? position : "";
  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}